

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

void voc_push_vocoldef_list(voccxdef *ctx,vocoldef *objlist,int cnt)

{
  uchar *puVar1;
  long lVar2;
  uint lstsiz;
  
  if (cnt < 1) {
    lstsiz = 0;
  }
  else {
    lVar2 = 0;
    lstsiz = 0;
    do {
      lstsiz = lstsiz + (uint)(*(short *)((long)&objlist->vocolobj + lVar2) != -1) * 2 + 1;
      lVar2 = lVar2 + 0x28;
    } while ((ulong)(uint)cnt * 0x28 != lVar2);
  }
  puVar1 = voc_push_list_siz(ctx,lstsiz);
  if (0 < cnt) {
    lVar2 = 0;
    do {
      if (*(short *)((long)&objlist->vocolobj + lVar2) == -1) {
        *puVar1 = '\x05';
        puVar1 = puVar1 + 1;
      }
      else {
        *puVar1 = '\x02';
        *(undefined2 *)(puVar1 + 1) = *(undefined2 *)((long)&objlist->vocolobj + lVar2);
        puVar1 = puVar1 + 3;
      }
      lVar2 = lVar2 + 0x28;
    } while ((ulong)(uint)cnt * 0x28 != lVar2);
  }
  return;
}

Assistant:

void voc_push_vocoldef_list(voccxdef *ctx, vocoldef *objlist, int cnt)
{
    int i;
    uchar *lstp;
    uint lstsiz;

    /* 
     *   count the size - we need 3 bytes per object (1 for type plus 2
     *   for the value), and 1 byte per nil 
     */
    for (lstsiz = 0, i = 0 ; i < cnt ; ++i)
        lstsiz += (objlist[i].vocolobj == MCMONINV ? 1 : 3);

    /* allocate space for the list */
    lstp = voc_push_list_siz(ctx, lstsiz);

    /* enter the list elements */
    for (i = 0 ; i < cnt ; ++i)
    {
        if (objlist[i].vocolobj == MCMONINV)
        {
            /* store the nil */
            *lstp++ = DAT_NIL;
        }
        else
        {
            /* add the type prefix */
            *lstp++ = DAT_OBJECT;

            /* add the value */
            oswp2(lstp, objlist[i].vocolobj);
            lstp += 2;
        }
    }
}